

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O0

unsigned_long crc32_little(unsigned_long crc,uchar *buf,uint len)

{
  uint uVar1;
  uint *puVar2;
  uint *local_28;
  u4 *buf4;
  u4 c;
  uint len_local;
  uchar *buf_local;
  unsigned_long crc_local;
  
  buf4._0_4_ = (uint)crc ^ 0xffffffff;
  _c = (uint *)buf;
  for (buf4._4_4_ = len; buf4._4_4_ != 0 && ((ulong)_c & 3) != 0; buf4._4_4_ = buf4._4_4_ - 1) {
    buf4._0_4_ = (uint)crc_table[0][((uint)buf4 ^ (byte)*_c) & 0xff] ^ (uint)buf4 >> 8;
    _c = (uint *)((long)_c + 1);
  }
  local_28 = _c;
  for (; 0x1f < buf4._4_4_; buf4._4_4_ = buf4._4_4_ - 0x20) {
    uVar1 = *local_28 ^ (uint)buf4;
    uVar1 = local_28[1] ^
            (uint)crc_table[3][uVar1 & 0xff] ^ (uint)crc_table[2][uVar1 >> 8 & 0xff] ^
            (uint)crc_table[1][uVar1 >> 0x10 & 0xff] ^ (uint)crc_table[0][uVar1 >> 0x18];
    uVar1 = local_28[2] ^
            (uint)crc_table[3][uVar1 & 0xff] ^ (uint)crc_table[2][uVar1 >> 8 & 0xff] ^
            (uint)crc_table[1][uVar1 >> 0x10 & 0xff] ^ (uint)crc_table[0][uVar1 >> 0x18];
    uVar1 = local_28[3] ^
            (uint)crc_table[3][uVar1 & 0xff] ^ (uint)crc_table[2][uVar1 >> 8 & 0xff] ^
            (uint)crc_table[1][uVar1 >> 0x10 & 0xff] ^ (uint)crc_table[0][uVar1 >> 0x18];
    uVar1 = local_28[4] ^
            (uint)crc_table[3][uVar1 & 0xff] ^ (uint)crc_table[2][uVar1 >> 8 & 0xff] ^
            (uint)crc_table[1][uVar1 >> 0x10 & 0xff] ^ (uint)crc_table[0][uVar1 >> 0x18];
    uVar1 = local_28[5] ^
            (uint)crc_table[3][uVar1 & 0xff] ^ (uint)crc_table[2][uVar1 >> 8 & 0xff] ^
            (uint)crc_table[1][uVar1 >> 0x10 & 0xff] ^ (uint)crc_table[0][uVar1 >> 0x18];
    puVar2 = local_28 + 7;
    uVar1 = local_28[6] ^
            (uint)crc_table[3][uVar1 & 0xff] ^ (uint)crc_table[2][uVar1 >> 8 & 0xff] ^
            (uint)crc_table[1][uVar1 >> 0x10 & 0xff] ^ (uint)crc_table[0][uVar1 >> 0x18];
    local_28 = local_28 + 8;
    uVar1 = *puVar2 ^ (uint)crc_table[3][uVar1 & 0xff] ^ (uint)crc_table[2][uVar1 >> 8 & 0xff] ^
                      (uint)crc_table[1][uVar1 >> 0x10 & 0xff] ^ (uint)crc_table[0][uVar1 >> 0x18];
    buf4._0_4_ = (uint)crc_table[3][uVar1 & 0xff] ^ (uint)crc_table[2][uVar1 >> 8 & 0xff] ^
                 (uint)crc_table[1][uVar1 >> 0x10 & 0xff] ^ (uint)crc_table[0][uVar1 >> 0x18];
  }
  for (; 3 < buf4._4_4_; buf4._4_4_ = buf4._4_4_ - 4) {
    uVar1 = *local_28 ^ (uint)buf4;
    buf4._0_4_ = (uint)crc_table[3][uVar1 & 0xff] ^ (uint)crc_table[2][uVar1 >> 8 & 0xff] ^
                 (uint)crc_table[1][uVar1 >> 0x10 & 0xff] ^ (uint)crc_table[0][uVar1 >> 0x18];
    local_28 = local_28 + 1;
  }
  for (; buf4._4_4_ != 0; buf4._4_4_ = buf4._4_4_ - 1) {
    buf4._0_4_ = (uint)crc_table[0][((uint)buf4 ^ (byte)*local_28) & 0xff] ^ (uint)buf4 >> 8;
    local_28 = (uint *)((long)local_28 + 1);
  }
  return (ulong)((uint)buf4 ^ 0xffffffff);
}

Assistant:

local unsigned long crc32_little(crc, buf, len)
    unsigned long crc;
    const unsigned char FAR *buf;
    unsigned len;
{
    register u4 c;
    register const u4 FAR *buf4;

    c = (u4)crc;
    c = ~c;
    while (len && ((ptrdiff_t)buf & 3)) {
        c = crc_table[0][(c ^ *buf++) & 0xff] ^ (c >> 8);
        len--;
    }

    buf4 = (const u4 FAR *)(const void FAR *)buf;
    while (len >= 32) {
        DOLIT32;
        len -= 32;
    }
    while (len >= 4) {
        DOLIT4;
        len -= 4;
    }
    buf = (const unsigned char FAR *)buf4;

    if (len) do {
        c = crc_table[0][(c ^ *buf++) & 0xff] ^ (c >> 8);
    } while (--len);
    c = ~c;
    return (unsigned long)c;
}